

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int width;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  string local_2a0;
  undefined1 local_280 [8];
  tm time_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  
  width = 1000;
  bVar1 = PortableLocaltime((long)this / 1000,(tm *)local_280);
  if (bVar1) {
    local_24 = time_struct.tm_mday + 0x76c;
    StreamableToString<int>(&local_2a0,&local_24);
    std::operator+(&local_128,&local_2a0,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_108,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_148,&local_128,&local_108);
    std::operator+(&local_168,&local_148,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_e8,(String *)(ulong)(uint)time_struct.tm_min,value_00)
    ;
    std::operator+(&local_188,&local_168,&local_e8);
    std::operator+(&local_1a8,&local_188,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_c8,(String *)(ulong)(uint)time_struct.tm_sec,value_01)
    ;
    std::operator+(&local_1c8,&local_1a8,&local_c8);
    std::operator+(&local_1e8,&local_1c8,":");
    String::FormatIntWidth2_abi_cxx11_(&local_a8,(String *)(ulong)(uint)local_280._4_4_,value_02);
    std::operator+(&local_208,&local_1e8,&local_a8);
    std::operator+(&local_228,&local_208,":");
    String::FormatIntWidth2_abi_cxx11_(&local_88,(String *)(ulong)(uint)local_280._0_4_,value_03);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &time_struct.tm_zone,&local_228,&local_88);
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &time_struct.tm_zone,".");
    String::FormatIntWidthN_abi_cxx11_(&local_68,(String *)((long)this % 1000 & 0xffffffff),3,width)
    ;
    std::operator+(__return_storage_ptr__,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&time_struct.tm_zone);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss.sss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec) + "." +
      String::FormatIntWidthN(static_cast<int>(ms % 1000), 3);
}